

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

int Gia_SweeperFraig(Gia_Man_t *p,Vec_Int_t *vProbeIds,char *pCommLime,int nWords,int nConfs,
                    int fVerify,int fVerbose)

{
  Gia_Man_t *pNew;
  Abc_Frame_t *pAVar1;
  Vec_Int_t *__ptr;
  ulong uVar2;
  int *__ptr_00;
  ulong uVar3;
  
  if (p->pData == (void *)0x0) {
    __assert_fail("Gia_SweeperIsRunning(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x42e,
                  "int Gia_SweeperFraig(Gia_Man_t *, Vec_Int_t *, char *, int, int, int, int)");
  }
  pNew = Gia_SweeperSweep(p,vProbeIds,nWords,nConfs,fVerify,fVerbose);
  if (pNew == (Gia_Man_t *)0x0) {
    return 0;
  }
  if (pCommLime != (char *)0x0) {
    pAVar1 = Abc_FrameGetGlobalFrame();
    Abc_FrameUpdateGia(pAVar1,pNew);
    pAVar1 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar1,pCommLime);
    pAVar1 = Abc_FrameGetGlobalFrame();
    pNew = Abc_FrameGetGia(pAVar1);
  }
  uVar3 = 0;
  __ptr = Gia_SweeperGraft(p,(Vec_Int_t *)0x0,pNew);
  Gia_ManStop(pNew);
  if (vProbeIds->nSize < 1) {
    __ptr_00 = __ptr->pArray;
    if (__ptr_00 == (int *)0x0) goto LAB_00736375;
  }
  else {
    uVar2 = (ulong)(uint)__ptr->nSize;
    if (__ptr->nSize < 1) {
      uVar2 = uVar3;
    }
    do {
      if (uVar2 == uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      __ptr_00 = __ptr->pArray;
      Gia_SweeperProbeUpdate(p,vProbeIds->pArray[uVar3],__ptr_00[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)vProbeIds->nSize);
  }
  free(__ptr_00);
LAB_00736375:
  free(__ptr);
  return 1;
}

Assistant:

int Gia_SweeperFraig( Gia_Man_t * p, Vec_Int_t * vProbeIds, char * pCommLime, int nWords, int nConfs, int fVerify, int fVerbose )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vLits;
    int ProbeId, i;
    // sweeper is running
    assert( Gia_SweeperIsRunning(p) );
    // sweep the logic
    pNew = Gia_SweeperSweep( p, vProbeIds, nWords, nConfs, fVerify, fVerbose );
    if ( pNew == NULL )
        return 0;
    // execute command line
    if ( pCommLime )
    {
        // set pNew to be current GIA in ABC
        Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), pNew );
        // execute command line pCommLine using Abc_CmdCommandExecute()
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), pCommLime );
        // get pNew to be current GIA in ABC     
        pNew = Abc_FrameGetGia( Abc_FrameGetGlobalFrame() );
    }
    // return logic back into the main manager
    vLits = Gia_SweeperGraft( p, NULL, pNew );
    Gia_ManStop( pNew );
    // update the array of probes
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
        Gia_SweeperProbeUpdate( p, ProbeId, Vec_IntEntry(vLits, i) );
    Vec_IntFree( vLits );        
    return 1;
}